

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_flow(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  bool bVar4;
  int iVar5;
  size_t sVar6;
  pfn_error p_Var7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  ulong len_;
  void *pvVar11;
  basic_substring<const_char> *pbVar12;
  byte bVar13;
  uint uVar14;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  ro_substr chars_01;
  ro_substr chars_02;
  first_of_any_result fVar15;
  substr sVar16;
  basic_substring<char> bVar17;
  char msg [72];
  csubstr tpkl;
  basic_substring<const_char> local_108;
  basic_substring<const_char> local_f8;
  char *local_e8;
  char *pcStack_e0;
  basic_substring<const_char> local_d8 [3];
  char *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  basic_substring<const_char> local_50;
  basic_substring<char> local_40;
  
  local_a8 = currscalar.str;
  bVar13 = 0;
  chars.len = 7;
  chars.str = "[]{}?#,";
  local_108 = peeked_line;
  sVar6 = basic_substring<const_char>::first_of(&local_108,chars,0);
  if (sVar6 != 0) {
    bVar4 = true;
    do {
      uVar14 = this->m_state->flags;
      if ((~uVar14 & 0x44) == 0 || (uVar14 & 2) != 0) {
        local_f8 = basic_substring<const_char>::triml(&local_108,' ');
        chars_00.len = 2;
        chars_00.str = "\r\n";
        local_50 = basic_substring<const_char>::trimr(&local_f8,chars_00);
        if (((local_50.len < 2) || (*local_50.str != ':')) || (local_50.str[1] != ' ')) {
          iVar5 = basic_substring<const_char>::compare(&local_50,':');
          if (iVar5 != 0) {
            local_f8.len = 2;
            local_f8.str = ": ";
            local_e8 = ":";
            pcStack_e0 = (char *)0x1;
            fVar15 = basic_substring<char_const>::
                     first_of_any_iter<c4::basic_substring<char_const>*>
                               ((basic_substring<char_const> *)&local_108,&local_f8,local_d8);
            len_ = fVar15.pos;
            if (sVar6 <= len_ || fVar15.which == 0xffffffffffffffff) goto LAB_00228737;
            if (local_108.len < len_) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar1 = (code *)swi(3);
                sVar16 = (substr)(*pcVar1)();
                return sVar16;
              }
              handle_error(0x2467aa,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x154e,"num <= len || num == npos");
            }
            basic_substring<const_char>::basic_substring(&local_f8,local_108.str,len_);
            local_108 = local_f8;
            pcVar10 = (this->m_state->line_contents).rem.str;
            pcVar8 = local_f8.str;
            sVar6 = local_f8.len;
            if (local_f8.str + local_f8.len < pcVar10) {
              pcVar10 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
              pbVar12 = &local_f8;
              for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                pbVar12->str = *(char **)pcVar10;
                pcVar10 = pcVar10 + ((ulong)bVar13 * -2 + 1) * 8;
                pbVar12 = (basic_substring<const_char> *)&pbVar12[-(ulong)bVar13].len;
              }
              if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar1 = (code *)swi(3);
                sVar16 = (substr)(*pcVar1)();
                return sVar16;
              }
              p_Var7 = (this->m_stack).m_callbacks.m_error;
              local_78 = 0;
              uStack_70 = 0x7561;
              local_68 = 0;
              pcStack_60 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_58 = 0x65;
              pvVar11 = (this->m_stack).m_callbacks.m_user_data;
              uStack_70._0_4_ = 0x7561;
              uVar14 = (uint)uStack_70;
              goto LAB_002289fd;
            }
LAB_00228a28:
            _line_progressed(this,(size_t)(pcVar8 + (sVar6 - (long)pcVar10)));
            break;
          }
        }
        local_108.len = 0;
        break;
      }
LAB_00228737:
      if (sVar6 != 0xffffffffffffffff) {
        if (local_108.len < sVar6) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            sVar16 = (substr)(*pcVar1)();
            return sVar16;
          }
          handle_error(0x2467aa,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        basic_substring<const_char>::basic_substring(&local_f8,local_108.str,sVar6);
        local_108 = local_f8;
        pcVar10 = (this->m_state->line_contents).rem.str;
        pcVar8 = local_f8.str;
        sVar6 = local_f8.len;
        if (local_f8.str + local_f8.len < pcVar10) {
          pcVar10 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
          pbVar12 = &local_f8;
          for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
            pbVar12->str = *(char **)pcVar10;
            pcVar10 = pcVar10 + ((ulong)bVar13 * -2 + 1) * 8;
            pbVar12 = (basic_substring<const_char> *)&pbVar12[-(ulong)bVar13].len;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            sVar16 = (substr)(*pcVar1)();
            return sVar16;
          }
          p_Var7 = (this->m_stack).m_callbacks.m_error;
          local_a0 = 0;
          uStack_98 = 0x756b;
          local_90 = 0;
          pcStack_88 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_80 = 0x65;
          pvVar11 = (this->m_stack).m_callbacks.m_user_data;
          uStack_98._0_4_ = 0x756b;
          uVar14 = (uint)uStack_98;
LAB_002289fd:
          auVar3 = ZEXT424(uVar14) << 0x40;
          LVar2.name.str._0_4_ = 0x2466fd;
          LVar2.super_LineCol.offset = auVar3._0_8_;
          LVar2.super_LineCol.line = auVar3._8_8_;
          LVar2.super_LineCol.col = auVar3._16_8_;
          LVar2.name.str._4_4_ = 0;
          LVar2.name.len = 0x65;
          (*p_Var7)((char *)&local_f8,0x48,LVar2,pvVar11);
          pcVar10 = (this->m_state->line_contents).rem.str;
          pcVar8 = local_108.str;
          sVar6 = local_108.len;
        }
        goto LAB_00228a28;
      }
      if ((!bVar4) && (bVar4 = _advance_to_peeked(this), !bVar4)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar1 = (code *)swi(3);
          sVar16 = (substr)(*pcVar1)();
          return sVar16;
        }
        local_f8 = (basic_substring<const_char>)(ZEXT816(0x7572) << 0x40);
        local_e8 = (char *)0x0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8[0].str = (char *)0x65;
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: _advance_to_peeked()",0x22,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_108 = _scan_to_next_nonempty_line(this,0);
      if (local_108.str == (char *)0x0 || local_108.len == 0) {
        bVar4 = is_debugger_attached();
        if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar1 = (code *)swi(3);
          sVar16 = (substr)(*pcVar1)();
          return sVar16;
        }
        fmt.len = 0x25;
        fmt.str = "ERROR: expected token or continuation";
        _err<>(this,fmt);
      }
      bVar4 = false;
      chars_01.len = 7;
      chars_01.str = "[]{}?#,";
      sVar6 = basic_substring<const_char>::first_of(&local_108,chars_01,0);
    } while (sVar6 != 0);
  }
  basic_substring<char>::basic_substring
            (&local_40,local_a8,(this->m_buf).str + (this->m_state->pos).super_LineCol.offset);
  chars_02.len = 3;
  chars_02.str = "\n\r ";
  bVar17 = basic_substring<char>::trimr(&local_40,chars_02);
  sVar16.str = bVar17.str;
  sVar16.len = bVar17.len;
  return sVar16;
}

Assistant:

substr Parser::_scan_plain_scalar_flow(csubstr currscalar, csubstr peeked_line)
{
    static constexpr const csubstr chars = "[]{}?#,";
    size_t pos = peeked_line.first_of(chars);
    bool first = true;
    while(pos != 0)
    {
        if(has_all(RMAP|RKEY) || has_any(RUNK))
        {
            csubstr tpkl = peeked_line.triml(' ').trimr("\r\n");
            if(tpkl.begins_with(": ") || tpkl == ':')
            {
                _c4dbgpf("rscalar[FLOW]: map value starts on the peeked line: '{}'", peeked_line);
                peeked_line = peeked_line.first(0);
                break;
            }
            else
            {
                auto colon_pos = peeked_line.first_of_any(": ", ":");
                if(colon_pos && colon_pos.pos < pos)
                {
                    peeked_line = peeked_line.first(colon_pos.pos);
                    _c4dbgpf("rscalar[FLOW]: found colon at {}. peeked='{}'", colon_pos.pos, peeked_line);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
                    _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
                    break;
                }
            }
        }
        if(pos != npos)
        {
            _c4dbgpf("rscalar[FLOW]: found special character '{}' at {}, stopping: '{}'", peeked_line[pos], pos, peeked_line.left_of(pos).trimr("\r\n"));
            peeked_line = peeked_line.left_of(pos);
            _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
            _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
            break;
        }
        _c4dbgpf("rscalar[FLOW]: append another line, full: '{}'", peeked_line.trimr("\r\n"));
        if(!first)
        {
            RYML_CHECK(_advance_to_peeked());
        }
        peeked_line = _scan_to_next_nonempty_line(/*indentation*/0);
        if(peeked_line.empty())
        {
            _c4err("expected token or continuation");
        }
        pos = peeked_line.first_of(chars);
        first = false;
    }
    substr full(m_buf.str + (currscalar.str - m_buf.str), m_buf.begin() + m_state->pos.offset);
    full = full.trimr("\n\r ");
    return full;
}